

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::ValidateMemOpCandidates
          (GlobOpt *this,Loop *loop,MemOpEmitData **inOrderEmitData,int *iEmitData)

{
  SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  Instr **ppIVar1;
  MemOpType MVar2;
  BasicBlock *pBVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  undefined4 *puVar9;
  Type *ppBVar10;
  Instr *pIVar11;
  Type *ppMVar12;
  JITTimeFunctionBody *pJVar13;
  FunctionJITTimeInfo *pFVar14;
  MemCopyCandidate *pMVar15;
  MemCopyEmitData *emitData;
  char16 *pcVar16;
  char16 *pcVar17;
  long lVar18;
  Func **ppFVar19;
  Instr *instr;
  ulong uVar20;
  char16_t *form;
  Instr *pIVar21;
  Type pMVar22;
  bool local_e8 [8];
  bool errorInInstr;
  Instr *local_88;
  MemOpEmitData **local_80;
  BasicBlock *local_78;
  Type local_70;
  Phases *local_68;
  undefined4 *local_60;
  undefined1 local_58 [8];
  Iterator iter;
  InductionVariableChangeInfo local_31 [8];
  InductionVariableChangeInfo inductionVariableChangeInfo;
  
  local_80 = inOrderEmitData;
  iter.current = (NodeBase *)loop;
  if (*iEmitData !=
      (loop->memOpInfo->candidates->
      super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
      count) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x44ab,"(iEmitData == (int)loop->memOpInfo->candidates->Count())",
                       "iEmitData == (int)loop->memOpInfo->candidates->Count()");
    if (!bVar5) goto LAB_0046eec3;
    *puVar9 = 0;
  }
  this_00 = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)(iter.current + 4);
  if (((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)iter.current[4].next == this_00
      ) || ((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
            ((((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)iter.current[4].next)->
             super_SListNodeBase<Memory::ArenaAllocator>).next)->next != this_00)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x44ad,"(loop->blockList.HasTwo())","loop->blockList.HasTwo()");
    if (!bVar5) {
LAB_0046eec3:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  local_58 = (undefined1  [8])(iter.current[0x30].next)->next;
  iter.list = (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)local_58;
  ppBVar10 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Head(this_00);
  local_78 = (*ppBVar10)->next;
  if (local_78->firstInstr == (Instr *)0x0) {
    pIVar21 = (Instr *)0x0;
  }
  else {
    pIVar21 = local_78->firstInstr->m_prev;
  }
  pBVar3 = local_78->next;
  ppFVar19 = (Func **)&pBVar3->firstInstr;
  if (pBVar3 == (BasicBlock *)0x0) {
    ppFVar19 = &local_78->func;
  }
  lVar18 = 0x18;
  if (pBVar3 == (BasicBlock *)0x0) {
    lVar18 = 0xd0;
  }
  instr = *(Instr **)((long)&(*ppFVar19)->m_alloc + lVar18);
  if (instr != pIVar21) {
    local_60 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pMVar22 = (Type)0x0;
    local_68 = (Phases *)&DAT_015a4e90;
    emitData = (MemCopyEmitData *)0x0;
    pIVar11 = (Instr *)0x0;
    local_88 = pIVar21;
    do {
      puVar9 = local_60;
      if ((pIVar11 != (Instr *)0x0) && (pIVar11->m_prev != instr)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x44b5,
                           "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == instr)",
                           "Modifying instr list but not using EDITING iterator!");
        if (!bVar5) goto LAB_0046eec3;
        *puVar9 = 0;
      }
      if (pMVar22 == (Type)0x0) {
        if (iter.list == (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)0x0
           ) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) goto LAB_0046eec3;
          *puVar9 = 0;
        }
        iter.list = (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                    ((iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])iter.list == local_58) {
          iter.list = (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
          break;
        }
        ppMVar12 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Iterator::
                   Data((Iterator *)local_58);
        pMVar22 = *ppMVar12;
        if (pMVar22 != (Type)0x0) {
          local_31[0] = (InductionVariableChangeInfo)0x0;
          bVar5 = JsUtil::
                  BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::TryGetValue<unsigned_int>
                            ((BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                              *)iter.current[0x30].next[2].next,&pMVar22->index,local_31);
          if (!bVar5) {
            if (DAT_015bc46a != '\x01') {
              return false;
            }
            pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
            uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
            pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
            uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
            bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemOpPhase,uVar6,uVar7);
            if (!bVar5) {
              pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
              uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
              pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
              uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
              bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemSetPhase,uVar6,uVar7);
              if (!bVar5) {
                pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
                uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
                pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
                uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
                bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemCopyPhase,uVar6,uVar7);
                if (!bVar5) {
                  return false;
                }
              }
            }
            Output::Print(L"TRACE MemOp:");
            pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
            pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar13);
            pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
            pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar14,(wchar (*) [42])local_e8);
            uVar6 = Loop::GetLoopNumber((Loop *)iter.current);
            Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar16,pcVar17,(ulong)uVar6);
            uVar20 = (ulong)pMVar22->base;
            form = L"MemOp skipped (s%d): no induction variable";
LAB_0046ee93:
            Output::Print(form,uVar20);
            Output::Print(L"\n");
            Output::Flush();
            return false;
          }
          if (((byte)local_31[0] & 0x7f) != pMVar22->count) {
            if (DAT_015bc46a != '\x01') {
              return false;
            }
            pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
            uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
            pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
            uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
            bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemOpPhase,uVar6,uVar7);
            if (!bVar5) {
              pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
              uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
              pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
              uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
              bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemSetPhase,uVar6,uVar7);
              if (!bVar5) {
                pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
                uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
                pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
                uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
                bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemCopyPhase,uVar6,uVar7);
                if (!bVar5) {
                  return false;
                }
              }
            }
            Output::Print(L"TRACE MemOp:");
            pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
            pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar13);
            pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
            pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar14,(wchar (*) [42])local_e8);
            uVar6 = Loop::GetLoopNumber((Loop *)iter.current);
            Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar16,pcVar17,(ulong)uVar6);
            uVar20 = (ulong)pMVar22->base;
            form = L"MemOp skipped (s%d): not matching unroll count";
            goto LAB_0046ee93;
          }
          MVar2 = pMVar22->type;
          local_70 = pMVar22;
          pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
          uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
          pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
          uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
          if (MVar2 == MEMSET) {
            bVar5 = Js::Phases::IsEnabled(local_68,MemSetPhase,uVar6,uVar7);
            puVar9 = local_60;
            pMVar22 = local_70;
            if (bVar5) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x44d7,
                                 "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::MemSetPhase)), ((this->func)->GetSourceContextId()), ((this->func)->GetLocalFunctionId())))"
                                 ,"!PHASE_OFF(Js::MemSetPhase, this->func)");
              if (!bVar5) goto LAB_0046eec3;
              *puVar9 = 0;
            }
            emitData = (MemCopyEmitData *)new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3eba5c);
            (emitData->super_MemOpEmitData).candidate = (MemOpCandidate *)0x0;
            (emitData->super_MemOpEmitData).stElemInstr = (Instr *)0x0;
            (emitData->super_MemOpEmitData).block = (BasicBlock *)0x0;
            (emitData->super_MemOpEmitData).inductionVar = (InductionVariableChangeInfo)0x0;
            *(undefined3 *)&(emitData->super_MemOpEmitData).field_0x19 = 0;
            (emitData->super_MemOpEmitData).bailOutKind = BailOutInvalid;
          }
          else {
            bVar5 = Js::Phases::IsEnabled(local_68,MemCopyPhase,uVar6,uVar7);
            puVar9 = local_60;
            pMVar22 = local_70;
            if (bVar5) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x44dc,
                                 "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::MemCopyPhase)), ((this->func)->GetSourceContextId()), ((this->func)->GetLocalFunctionId())))"
                                 ,"!PHASE_OFF(Js::MemCopyPhase, this->func)");
              if (!bVar5) goto LAB_0046eec3;
              *puVar9 = 0;
            }
            if (pMVar22->type != MEMCOPY) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x44de,"(candidate->IsMemCopy())","candidate->IsMemCopy()");
              if (!bVar5) goto LAB_0046eec3;
              *puVar9 = 0;
            }
            pMVar15 = Loop::MemOpCandidate::AsMemCopy(pMVar22);
            if ((((pMVar15->super_MemOpCandidate).base == 0xffffffff) ||
                (pMVar15->ldBase == 0xffffffff)) ||
               (pMVar15->ldCount != (pMVar15->super_MemOpCandidate).count)) {
              pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
              uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
              pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
              uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
              bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemOpPhase,uVar6,uVar7);
              if (!bVar5) {
                pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
                uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
                pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
                uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
                bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemCopyPhase,uVar6,uVar7);
                if (!bVar5) {
                  return false;
                }
              }
              Output::Print(L"TRACE MemCopy:");
              pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
              pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar13);
              pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
              pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar14,(wchar (*) [42])local_e8);
              uVar6 = Loop::GetLoopNumber((Loop *)iter.current);
              Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar16,pcVar17,(ulong)uVar6);
              uVar20 = (ulong)pMVar22->base;
              form = L"(s%d): not matching ldElem and stElem";
              goto LAB_0046ee93;
            }
            emitData = (MemCopyEmitData *)new<Memory::JitArenaAllocator>(0x28,this->alloc,0x3eba5c);
            (emitData->super_MemOpEmitData).candidate = (MemOpCandidate *)0x0;
            (emitData->super_MemOpEmitData).stElemInstr = (Instr *)0x0;
            (emitData->super_MemOpEmitData).block = (BasicBlock *)0x0;
            (emitData->super_MemOpEmitData).inductionVar = (InductionVariableChangeInfo)0x0;
            *(undefined3 *)&(emitData->super_MemOpEmitData).field_0x19 = 0;
            (emitData->super_MemOpEmitData).bailOutKind = BailOutInvalid;
            emitData->ldElemInstr = (Instr *)0x0;
          }
          (emitData->super_MemOpEmitData).block = local_78;
          (emitData->super_MemOpEmitData).inductionVar = local_31[0];
          (emitData->super_MemOpEmitData).candidate = pMVar22;
          goto LAB_0046e799;
        }
LAB_0046e856:
        pMVar22 = (Type)0x0;
      }
      else {
LAB_0046e799:
        local_e8[0] = false;
        if (pMVar22->type == MEMSET) {
          bVar5 = InspectInstrForMemSetCandidate
                            (this,(Loop *)iter.current,instr,(MemSetEmitData *)emitData,local_e8);
        }
        else {
          bVar5 = InspectInstrForMemCopyCandidate(this,(Loop *)iter.current,instr,emitData,local_e8)
          ;
        }
        if (local_e8[0] != false) {
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                     this->alloc,emitData,0x20);
          return false;
        }
        if (bVar5 != false) {
          iVar8 = *iEmitData;
          if (iVar8 < 1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x44fa,"(iEmitData > 0)","iEmitData > 0");
            if (!bVar5) goto LAB_0046eec3;
            *puVar9 = 0;
            iVar8 = *iEmitData;
            if (iVar8 == 0) break;
          }
          *iEmitData = iVar8 + -1;
          local_80[iVar8 + -1] = &emitData->super_MemOpEmitData;
          emitData = (MemCopyEmitData *)0x0;
          goto LAB_0046e856;
        }
      }
      ppIVar1 = &instr->m_prev;
      pIVar11 = instr;
      instr = *ppIVar1;
    } while (*ppIVar1 != local_88);
  }
  bVar5 = true;
  if ((iter.list != (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
     ((undefined1  [8])iter.list != local_58)) {
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemOpPhase,uVar6,uVar7);
    if (!bVar5) {
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
      pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemSetPhase,uVar6,uVar7);
      if (!bVar5) {
        pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
        pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
        bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemCopyPhase,uVar6,uVar7);
        if (!bVar5) {
          return false;
        }
      }
    }
    bVar5 = false;
    Output::Print(L"TRACE MemOp:");
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar13);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar14,(wchar (*) [42])local_e8);
    uVar6 = Loop::GetLoopNumber((Loop *)iter.current);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar16,pcVar17,(ulong)uVar6);
    Output::Print(L"Candidates not found in loop while validating");
    Output::Print(L"\n");
    Output::Flush();
  }
  return bVar5;
}

Assistant:

bool
GlobOpt::ValidateMemOpCandidates(Loop * loop, _Out_writes_(iEmitData) MemOpEmitData** inOrderEmitData, int& iEmitData)
{
    AnalysisAssert(iEmitData == (int)loop->memOpInfo->candidates->Count());
    // We iterate over the second block of the loop only. MemOp Works only if the loop has exactly 2 blocks
    Assert(loop->blockList.HasTwo());

    Loop::MemOpList::Iterator iter(loop->memOpInfo->candidates);
    BasicBlock* bblock = loop->blockList.Head()->next;
    Loop::MemOpCandidate* candidate = nullptr;
    MemOpEmitData* emitData = nullptr;

    // Iterate backward because the list of candidate is reversed
    FOREACH_INSTR_BACKWARD_IN_BLOCK(instr, bblock)
    {
        if (!candidate)
        {
            // Time to check next candidate
            if (!iter.Next())
            {
                // We have been through the whole list of candidates, finish
                break;
            }
            candidate = iter.Data();
            if (!candidate)
            {
                continue;
            }

            // Common check for memset and memcopy
            Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { 0, 0 };

            // Get the inductionVariable changeInfo
            if (!loop->memOpInfo->inductionVariableChangeInfoMap->TryGetValue(candidate->index, &inductionVariableChangeInfo))
            {
                TRACE_MEMOP_VERBOSE(loop, nullptr, _u("MemOp skipped (s%d): no induction variable"), candidate->base);
                return false;
            }

            if (inductionVariableChangeInfo.unroll != candidate->count)
            {
                TRACE_MEMOP_VERBOSE(loop, nullptr, _u("MemOp skipped (s%d): not matching unroll count"), candidate->base);
                return false;
            }

            if (candidate->IsMemSet())
            {
                Assert(!PHASE_OFF(Js::MemSetPhase, this->func));
                emitData = JitAnew(this->alloc, MemSetEmitData);
            }
            else
            {
                Assert(!PHASE_OFF(Js::MemCopyPhase, this->func));
                // Specific check for memcopy
                Assert(candidate->IsMemCopy());
                Loop::MemCopyCandidate* memcopyCandidate = candidate->AsMemCopy();

                if (memcopyCandidate->base == Js::Constants::InvalidSymID
                    || memcopyCandidate->ldBase == Js::Constants::InvalidSymID
                    || (memcopyCandidate->ldCount != memcopyCandidate->count))
                {
                    TRACE_MEMOP_PHASE(MemCopy, loop, nullptr, _u("(s%d): not matching ldElem and stElem"), candidate->base);
                    return false;
                }
                emitData = JitAnew(this->alloc, MemCopyEmitData);
            }
            Assert(emitData);
            emitData->block = bblock;
            emitData->inductionVar = inductionVariableChangeInfo;
            emitData->candidate = candidate;
        }
        bool errorInInstr = false;
        bool candidateFound = candidate->IsMemSet() ?
            InspectInstrForMemSetCandidate(loop, instr, (MemSetEmitData*)emitData, errorInInstr)
            : InspectInstrForMemCopyCandidate(loop, instr, (MemCopyEmitData*)emitData, errorInInstr);
        if (errorInInstr)
        {
            JitAdelete(this->alloc, emitData);
            return false;
        }
        if (candidateFound)
        {
            AnalysisAssert(iEmitData > 0);
            if (iEmitData == 0)
            {
                // Explicit for OACR
                break;
            }
            inOrderEmitData[--iEmitData] = emitData;
            candidate = nullptr;
            emitData = nullptr;

        }
    } NEXT_INSTR_BACKWARD_IN_BLOCK;

    if (iter.IsValid())
    {
        TRACE_MEMOP(loop, nullptr, _u("Candidates not found in loop while validating"));
        return false;
    }
    return true;
}